

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmGhsMultiTargetGenerator::WriteBuildEventsHelper
          (cmGhsMultiTargetGenerator *this,ostream *fout,
          vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *ccv,string *name,string *cmd)

{
  pointer pcVar1;
  pointer pbVar2;
  bool bVar3;
  ostream *poVar4;
  uint uVar5;
  uint uVar6;
  uint __val;
  string *psVar7;
  long *plVar8;
  ostream *poVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  _func_int **pp_Var11;
  long *plVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *byp;
  pointer pbVar13;
  uint __len;
  pointer cc;
  string fname;
  cmGeneratedFileStream f;
  cmCustomCommandGenerator ccg;
  long *local_3d0;
  long local_3c8;
  long local_3c0;
  long lStack_3b8;
  string local_3b0;
  string *local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_388;
  ostream *local_380;
  pointer local_378;
  string *local_370;
  cmCustomCommand *local_368;
  string local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  undefined1 local_320 [16];
  _func_int *local_310;
  long lStack_308;
  cmCustomCommandGenerator local_d8;
  
  cc = (ccv->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_378 = (ccv->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  if (cc != local_378) {
    local_388 = &this->Name;
    __val = 0;
    local_390 = cmd;
    local_380 = fout;
    local_370 = name;
    do {
      pcVar1 = (this->ConfigName)._M_dataplus._M_p;
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_360,pcVar1,pcVar1 + (this->ConfigName)._M_string_length);
      local_368 = cc;
      cmCustomCommandGenerator::cmCustomCommandGenerator
                (&local_d8,cc,&local_360,&this->LocalGenerator->super_cmLocalGenerator);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
      psVar7 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                         (&this->LocalGenerator->super_cmLocalGenerator);
      poVar4 = local_380;
      local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
      pcVar1 = (psVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3b0,pcVar1,pcVar1 + psVar7->_M_string_length);
      (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xc])
                (&local_3d0,this->LocalGenerator,this->GeneratorTarget);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_3d0,0,(char *)0x0,0x53d12d);
      local_320._0_8_ = &local_310;
      pp_Var11 = (_func_int **)(plVar8 + 2);
      if ((_func_int **)*plVar8 == pp_Var11) {
        local_310 = *pp_Var11;
        lStack_308 = plVar8[3];
      }
      else {
        local_310 = *pp_Var11;
        local_320._0_8_ = (_func_int **)*plVar8;
      }
      local_320._8_8_ = plVar8[1];
      *plVar8 = (long)pp_Var11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_3b0,local_320._0_8_);
      if ((_func_int **)local_320._0_8_ != &local_310) {
        operator_delete((void *)local_320._0_8_,(ulong)(local_310 + 1));
      }
      if (local_3d0 != &local_3c0) {
        operator_delete(local_3d0,local_3c0 + 1);
      }
      std::operator+(&local_340,"/",local_388);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_340);
      local_3d0 = &local_3c0;
      plVar12 = plVar8 + 2;
      if ((long *)*plVar8 == plVar12) {
        local_3c0 = *plVar12;
        lStack_3b8 = plVar8[3];
      }
      else {
        local_3c0 = *plVar12;
        local_3d0 = (long *)*plVar8;
      }
      local_3c8 = plVar8[1];
      *plVar8 = (long)plVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_3d0,(ulong)(local_370->_M_dataplus)._M_p);
      local_320._0_8_ = &local_310;
      pp_Var11 = (_func_int **)(plVar8 + 2);
      if ((_func_int **)*plVar8 == pp_Var11) {
        local_310 = *pp_Var11;
        lStack_308 = plVar8[3];
      }
      else {
        local_310 = *pp_Var11;
        local_320._0_8_ = (_func_int **)*plVar8;
      }
      local_320._8_8_ = plVar8[1];
      *plVar8 = (long)pp_Var11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_3b0,local_320._0_8_);
      if ((_func_int **)local_320._0_8_ != &local_310) {
        operator_delete((void *)local_320._0_8_,(ulong)(local_310 + 1));
      }
      if (local_3d0 != &local_3c0) {
        operator_delete(local_3d0,local_3c0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      __len = 1;
      if (9 < __val) {
        uVar5 = 4;
        uVar6 = __val;
        do {
          __len = uVar5;
          if (uVar6 < 100) {
            __len = __len - 2;
            goto LAB_002285a8;
          }
          if (uVar6 < 1000) {
            __len = __len - 1;
            goto LAB_002285a8;
          }
          if (uVar6 < 10000) goto LAB_002285a8;
          bVar3 = 99999 < uVar6;
          uVar5 = __len + 4;
          uVar6 = uVar6 / 10000;
        } while (bVar3);
        __len = __len + 1;
      }
LAB_002285a8:
      local_320._0_8_ = &local_310;
      std::__cxx11::string::_M_construct((ulong)local_320,(char)__len);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_320._0_8_,__len,__val);
      std::__cxx11::string::_M_append((char *)&local_3b0,local_320._0_8_);
      if ((_func_int **)local_320._0_8_ != &local_310) {
        operator_delete((void *)local_320._0_8_,(ulong)(local_310 + 1));
      }
      std::__cxx11::string::append((char *)&local_3b0);
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)local_320,&local_3b0,false,None);
      cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_320,true);
      WriteCustomCommandsHelper(this,(ostream *)local_320,&local_d8);
      cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_320);
      if (this->TagType == CUSTOM_TARGET) {
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_3b0._M_dataplus._M_p,local_3b0._M_string_length);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    :outputName=\"",0x11);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_3b0._M_dataplus._M_p,local_3b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,".rule\"",6);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    :",5);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(local_390->_M_dataplus)._M_p,local_390->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"=\"",2);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_3b0._M_dataplus._M_p,local_3b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"",1);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      }
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      pvVar10 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(&local_d8);
      pbVar2 = (pvVar10->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar13 = (pvVar10->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar2;
          pbVar13 = pbVar13 + 1) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    :extraOutputFile=\"",0x16);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"",1);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_320);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
      __val = __val + 1;
      cmCustomCommandGenerator::~cmCustomCommandGenerator(&local_d8);
      cc = local_368 + 1;
    } while (cc != local_378);
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteBuildEventsHelper(
  std::ostream& fout, const std::vector<cmCustomCommand>& ccv,
  std::string const& name, std::string const& cmd)
{
  int cmdcount = 0;

  for (cmCustomCommand const& cc : ccv) {
    cmCustomCommandGenerator ccg(cc, this->ConfigName, this->LocalGenerator);
    // Open the filestream for this custom command
    std::string fname = this->LocalGenerator->GetCurrentBinaryDirectory();
    fname +=
      "/" + this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
    fname += "/" + this->Name + "_" + name;
    fname += std::to_string(cmdcount++);
    fname += this->CmdWindowsShell ? ".bat" : ".sh";
    cmGeneratedFileStream f(fname);
    f.SetCopyIfDifferent(true);
    this->WriteCustomCommandsHelper(f, ccg);
    f.Close();
    if (this->TagType != GhsMultiGpj::CUSTOM_TARGET) {
      fout << "    :" << cmd << "=\"" << fname << "\"" << std::endl;
    } else {
      fout << fname << std::endl;
      fout << "    :outputName=\"" << fname << ".rule\"" << std::endl;
    }
    for (auto& byp : ccg.GetByproducts()) {
      fout << "    :extraOutputFile=\"" << byp << "\"" << std::endl;
    }
  }
}